

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  char **in_RSI;
  int in_EDI;
  bool isok_7;
  size_t k_7;
  bool isok_6;
  size_t k_6;
  bool isok_5;
  size_t k_5;
  bool isok_4;
  size_t k_4;
  bool isok_3;
  size_t k_3;
  bool isok_2;
  size_t k_2;
  bool isok_1;
  size_t k_1;
  bool isok;
  size_t k;
  size_t array_in_bytes;
  int c;
  bool tabular;
  bool verbose;
  size_t iterations;
  size_t m;
  size_t n;
  undefined1 in_stack_00002812;
  undefined1 in_stack_00002813;
  uint32_t in_stack_00002814;
  uint32_t in_stack_00002818;
  uint32_t in_stack_0000281c;
  string *in_stack_00002820;
  undefined1 in_stack_000028fd;
  undefined1 in_stack_000028fe;
  undefined1 in_stack_000028ff;
  pospopcnt_u16_method_type in_stack_00002900;
  uint32_t in_stack_0000290c;
  uint32_t in_stack_00002910;
  uint32_t in_stack_00002914;
  string *in_stack_00002918;
  allocator local_251;
  string local_250 [39];
  undefined1 local_229;
  ulong local_228;
  allocator local_219;
  string local_218 [39];
  undefined1 local_1f1;
  ulong local_1f0;
  allocator local_1e1;
  string local_1e0 [39];
  undefined1 local_1b9;
  ulong local_1b8;
  allocator local_1a9;
  string local_1a8 [39];
  undefined1 local_181;
  ulong local_180;
  allocator local_171;
  string local_170 [39];
  undefined1 local_149;
  ulong local_148;
  allocator local_139;
  string local_138 [39];
  undefined1 local_111;
  ulong local_110;
  allocator local_101;
  string local_100 [39];
  undefined1 local_d9;
  ulong local_d8;
  allocator local_c9;
  string local_c8 [39];
  undefined1 local_a1;
  ulong local_a0;
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  long local_38;
  int local_30;
  byte local_2a;
  byte local_29;
  ulong local_28;
  longlong local_20;
  ulong local_18;
  char **local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_18 = 100000;
  local_20 = 1;
  local_28 = 0;
  local_29 = 0;
  local_2a = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_30 = getopt(local_8,local_10,"vhtm:n:i:"), local_30 != -1) {
    switch(local_30) {
    case 0x68:
      print_usage((char *)0x1850fb);
      return 0;
    case 0x69:
      iVar3 = atoi(_optarg);
      local_28 = (ulong)iVar3;
      break;
    default:
      abort();
    case 0x6d:
      local_20 = atoll(_optarg);
      break;
    case 0x6e:
      local_18 = atoll(_optarg);
      break;
    case 0x74:
      local_2a = 1;
      break;
    case 0x76:
      local_29 = 1;
    }
  }
  if (0xffffffff < local_18) {
    printf("setting n to %u \n",0xffffffff);
    local_18 = 0xffffffff;
  }
  if (0xffffffff < local_28) {
    printf("setting iterations to %u \n",0xffffffff);
    local_28 = 0xffffffff;
  }
  if (local_28 == 0) {
    if (local_20 * local_18 < 1000000) {
      local_28 = 100;
    }
    else {
      local_28 = 10;
    }
  }
  if (local_18 == 0) {
    printf("n cannot be zero.\n");
    local_4 = 1;
  }
  else {
    local_38 = local_18 * 2 * local_20;
    if ((local_2a & 1) != 0) {
      printf("Method\tSz\tIt\tI/c\tC/w\tI/w\tCycles\tInstructions\tBMiss\tCRef\tCMiss\tTime\tMBs\n")
      ;
    }
    if (((local_29 & 1) != 0) && ((local_2a & 1) == 0)) {
      printf("%-40s\t","memcpy-8");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"memcpy-8",&local_59);
    benchmarkMemoryCopy(in_stack_00002820,in_stack_0000281c,in_stack_00002818,in_stack_00002814,
                        (bool)in_stack_00002813,(bool)in_stack_00002812);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    if (((local_29 & 1) != 0) && ((local_2a & 1) == 0)) {
      printf("%-40s\t","memcpy-16");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"memcpy-16",&local_91);
    benchmarkMemoryCopy(in_stack_00002820,in_stack_0000281c,in_stack_00002818,in_stack_00002814,
                        (bool)in_stack_00002813,(bool)in_stack_00002812);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    for (local_a0 = 0; local_a0 < 7; local_a0 = local_a0 + 1) {
      if (((local_29 & 1) != 0) && ((local_2a & 1) == 0)) {
        printf("%-40s\t",pospopcnt_u16_method_names[local_a0]);
      }
      fflush((FILE *)0x0);
      pcVar1 = pospopcnt_u16_method_names[local_a0];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c8,pcVar1,&local_c9);
      bVar2 = benchmarkMany(in_stack_00002918,in_stack_00002914,in_stack_00002910,in_stack_0000290c,
                            in_stack_00002900,(bool)in_stack_000028ff,(bool)in_stack_000028fe,
                            (bool)in_stack_000028fd);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      local_a1 = bVar2;
      if (!bVar2) {
        printf("Problem detected with %s.\n",pospopcnt_u16_method_names[local_a0]);
      }
    }
    for (local_d8 = 0; local_d8 < 7; local_d8 = local_d8 + 1) {
      if (((local_29 & 1) != 0) && ((local_2a & 1) == 0)) {
        printf("%-40s\t",pospopcnt_u16_method_names[local_d8 + 7]);
      }
      fflush((FILE *)0x0);
      pcVar1 = pospopcnt_u16_method_names[local_d8 + 7];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,pcVar1,&local_101);
      bVar2 = benchmarkMany(in_stack_00002918,in_stack_00002914,in_stack_00002910,in_stack_0000290c,
                            in_stack_00002900,(bool)in_stack_000028ff,(bool)in_stack_000028fe,
                            (bool)in_stack_000028fd);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      local_d9 = bVar2;
      if (!bVar2) {
        printf("Problem detected with %s.\n",pospopcnt_u16_method_names[local_d8 + 7]);
      }
    }
    for (local_110 = 0; local_110 < 0xc; local_110 = local_110 + 1) {
      if (((local_29 & 1) != 0) && ((local_2a & 1) == 0)) {
        printf("%-40s\t",pospopcnt_u16_method_names[local_110 + 0xe]);
      }
      fflush((FILE *)0x0);
      pcVar1 = pospopcnt_u16_method_names[local_110 + 0xe];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_138,pcVar1,&local_139);
      bVar2 = benchmarkMany(in_stack_00002918,in_stack_00002914,in_stack_00002910,in_stack_0000290c,
                            in_stack_00002900,(bool)in_stack_000028ff,(bool)in_stack_000028fe,
                            (bool)in_stack_000028fd);
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      local_111 = bVar2;
      if (!bVar2) {
        printf("Problem detected with %s.\n",pospopcnt_u16_method_names[local_110 + 0xe]);
      }
    }
    for (local_148 = 0; local_148 < 0xc; local_148 = local_148 + 1) {
      if (((local_29 & 1) != 0) && ((local_2a & 1) == 0)) {
        printf("%-40s\t",pospopcnt_u16_method_names[local_148 + 0x1a]);
      }
      fflush((FILE *)0x0);
      pcVar1 = pospopcnt_u16_method_names[local_148 + 0x1a];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,pcVar1,&local_171);
      bVar2 = benchmarkMany(in_stack_00002918,in_stack_00002914,in_stack_00002910,in_stack_0000290c,
                            in_stack_00002900,(bool)in_stack_000028ff,(bool)in_stack_000028fe,
                            (bool)in_stack_000028fd);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      local_149 = bVar2;
      if (!bVar2) {
        printf("Problem detected with %s.\n",pospopcnt_u16_method_names[local_148 + 0x1a]);
      }
    }
    for (local_180 = 0; local_180 < 6; local_180 = local_180 + 1) {
      if (((local_29 & 1) != 0) && ((local_2a & 1) == 0)) {
        printf("%-40s\t",pospopcnt_u8_method_names[local_180 + 1]);
      }
      fflush((FILE *)0x0);
      pcVar1 = pospopcnt_u8_method_names[local_180 + 1];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1a8,pcVar1,&local_1a9);
      bVar2 = benchmarkMany8(in_stack_00002918,in_stack_00002914,in_stack_00002910,in_stack_0000290c
                             ,(pospopcnt_u8_method_type)in_stack_00002900,(bool)in_stack_000028ff,
                             (bool)in_stack_000028fe,(bool)in_stack_000028fd);
      std::__cxx11::string::~string(local_1a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
      local_181 = bVar2;
      if (!bVar2) {
        printf("Problem detected with %s.\n",pospopcnt_u8_method_names[local_180 + 1]);
      }
    }
    for (local_1b8 = 0; local_1b8 < 8; local_1b8 = local_1b8 + 1) {
      if (((local_29 & 1) != 0) && ((local_2a & 1) == 0)) {
        printf("%-40s\t",pospopcnt_u8_method_names[local_1b8 + 7]);
      }
      fflush((FILE *)0x0);
      pcVar1 = pospopcnt_u8_method_names[local_1b8 + 7];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e0,pcVar1,&local_1e1);
      bVar2 = benchmarkMany8(in_stack_00002918,in_stack_00002914,in_stack_00002910,in_stack_0000290c
                             ,(pospopcnt_u8_method_type)in_stack_00002900,(bool)in_stack_000028ff,
                             (bool)in_stack_000028fe,(bool)in_stack_000028fd);
      std::__cxx11::string::~string(local_1e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
      local_1b9 = bVar2;
      if (!bVar2) {
        printf("Problem detected with %s.\n",pospopcnt_u8_method_names[local_1b8 + 7]);
      }
    }
    for (local_1f0 = 0; local_1f0 < 0xd; local_1f0 = local_1f0 + 1) {
      if (((local_29 & 1) != 0) && ((local_2a & 1) == 0)) {
        printf("%-40s\t",pospopcnt_u8_method_names[local_1f0 + 0xf]);
      }
      fflush((FILE *)0x0);
      pcVar1 = pospopcnt_u8_method_names[local_1f0 + 0xf];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_218,pcVar1,&local_219);
      bVar2 = benchmarkMany8(in_stack_00002918,in_stack_00002914,in_stack_00002910,in_stack_0000290c
                             ,(pospopcnt_u8_method_type)in_stack_00002900,(bool)in_stack_000028ff,
                             (bool)in_stack_000028fe,(bool)in_stack_000028fd);
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      local_1f1 = bVar2;
      if (!bVar2) {
        printf("Problem detected with %s.\n",pospopcnt_u8_method_names[local_1f0 + 0xf]);
      }
    }
    for (local_228 = 0; local_228 < 0xd; local_228 = local_228 + 1) {
      if (((local_29 & 1) != 0) && ((local_2a & 1) == 0)) {
        printf("%-40s\t",pospopcnt_u8_method_names[local_228 + 0x1c]);
      }
      fflush((FILE *)0x0);
      pcVar1 = pospopcnt_u8_method_names[local_228 + 0x1c];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_250,pcVar1,&local_251);
      bVar2 = benchmarkMany8(in_stack_00002918,in_stack_00002914,in_stack_00002910,in_stack_0000290c
                             ,(pospopcnt_u8_method_type)in_stack_00002900,(bool)in_stack_000028ff,
                             (bool)in_stack_000028fe,(bool)in_stack_000028fd);
      std::__cxx11::string::~string(local_250);
      std::allocator<char>::~allocator((allocator<char> *)&local_251);
      local_229 = bVar2;
      if (!bVar2) {
        printf("Problem detected with %s.\n",pospopcnt_u8_method_names[local_228 + 0x1c]);
      }
    }
    if ((local_29 & 1) == 0) {
      printf("Try -v to get more details.\n");
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
    size_t n = 100000;
    size_t m = 1;
    size_t iterations = 0; 
    bool verbose = false;
    bool tabular = false;
    int c;

    while ((c = getopt(argc, argv, "vhtm:n:i:")) != -1) {
        switch (c) {
        case 'n':
            n = atoll(optarg);
            break;
        case 'm':
            m = atoll(optarg);
            break;
        case 'v':
            verbose = true;
            break;
        case 't':
            tabular = true;
            break;
        case 'h':
            print_usage(argv[0]);
            return EXIT_SUCCESS;
        case 'i':
            iterations = atoi(optarg);
            break;
        default:
            abort();
        }
    }

    if(n > UINT32_MAX) {
       printf("setting n to %u \n", UINT32_MAX);
       n = UINT32_MAX;
    }

    if(iterations > UINT32_MAX) {
       printf("setting iterations to %u \n", UINT32_MAX);
       iterations = UINT32_MAX;
    }

    if(iterations == 0) {
      if(m*n < 1000000) iterations = 100;
      else iterations = 10;
    }
    // printf("n = %zu m = %zu \n", n, m);
    // printf("iterations = %zu \n", iterations);
    if(n == 0) {
       printf("n cannot be zero.\n");
       return EXIT_FAILURE;
    }

    size_t array_in_bytes = sizeof(uint16_t) * n * m;
    // if(array_in_bytes < 1024) {
    //   printf("array size: %zu B\n", array_in_bytes);
    // } else if (array_in_bytes < 1024 * 1024) {
    //   printf("array size: %.3f kB\n", array_in_bytes / 1024.);
    // } else {
    //   printf("array size: %.3f MB\n", array_in_bytes / (1024 * 1024.));
    // }

// #if POSPOPCNT_SIMD_VERSION >= 5
//     measurepopcnt(n*m, iterations, verbose);
// #endif
//     measureoverhead(n*m, iterations, verbose);
    
    if (tabular)
        printf("Method\tSz\tIt\tI/c\tC/w\tI/w\tCycles\tInstructions\tBMiss\tCRef\tCMiss\tTime\tMBs\n");

    if (verbose && !tabular) printf("%-40s\t", "memcpy-8");
    benchmarkMemoryCopy("memcpy-8", n, m, iterations, verbose, tabular);
    if (verbose && !tabular) printf("%-40s\t", "memcpy-16");
    benchmarkMemoryCopy("memcpy-16", 2*n, m, iterations, verbose, tabular);

    for (size_t k = 0; k < 7; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u16_method_names[k]);
        fflush(NULL);
        bool isok = benchmarkMany(pospopcnt_u16_method_names[k], n, m, iterations, pospopcnt_u16_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u16_method_names[k]);
        }
        // if (verbose) printf("\n");
    }
#if POSPOPCNT_SIMD_VERSION >= 3
    for (size_t k = 0; k < 7; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u16_method_names[7+k]);
        fflush(NULL);
        bool isok = benchmarkMany(pospopcnt_u16_method_names[7+k], n, m, iterations, pospopcnt_u16_sse_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u16_method_names[7+k]);
        }
        // if (verbose) printf("\n");
    }
#endif

#if POSPOPCNT_SIMD_VERSION >= 5
    for (size_t k = 0; k < 12; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u16_method_names[14+k]);
        fflush(NULL);
        bool isok = benchmarkMany(pospopcnt_u16_method_names[14+k], n, m, iterations, pospopcnt_u16_avx2_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u16_method_names[14+k]);
        }
        // if (verbose) printf("\n");
    }
#endif

#if POSPOPCNT_SIMD_VERSION >= 6
    for (size_t k = 0; k < 12; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u16_method_names[26+k]);
        fflush(NULL);
        bool isok = benchmarkMany(pospopcnt_u16_method_names[26+k], n, m, iterations, pospopcnt_u16_avx512_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u16_method_names[26+k]);
        }
        // if (verbose) printf("\n");
    }
#endif

    for (size_t k = 0; k < 6; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u8_method_names[k+1]);
        fflush(NULL);
        bool isok = benchmarkMany8(pospopcnt_u8_method_names[k+1], n, m, iterations, pospopcnt_u8_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u8_method_names[k+1]);
        }
        // if (verbose) printf("\n");
    }

#if POSPOPCNT_SIMD_VERSION >= 3
    for (size_t k = 0; k < 8; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u8_method_names[k+1+6]);
        fflush(NULL);
        bool isok = benchmarkMany8(pospopcnt_u8_method_names[k+1+6], n, m, iterations, pospopcnt_u8_sse_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u8_method_names[k+1+6]);
        }
        // if (verbose) printf("\n");
    }
#endif

#if POSPOPCNT_SIMD_VERSION >= 5
    for (size_t k = 0; k < 13; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u8_method_names[k+1+6+8]);
        fflush(NULL);
        bool isok = benchmarkMany8(pospopcnt_u8_method_names[k+1+6+8], n, m, iterations, pospopcnt_u8_avx2_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u8_method_names[k+1+6+8]);
        }
        // if (verbose) printf("\n");
    }
#endif

#if POSPOPCNT_SIMD_VERSION >= 6
    for (size_t k = 0; k < 13; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u8_method_names[k+1+6+8+13]);
        fflush(NULL);
        bool isok = benchmarkMany8(pospopcnt_u8_method_names[k+1+6+8+13], n, m, iterations, pospopcnt_u8_avx512_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u8_method_names[k+1+6+8+13]);
        }
        // if (verbose) printf("\n");
    }
#endif

    if (!verbose)
        printf("Try -v to get more details.\n");

    return EXIT_SUCCESS;
}